

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_array_view.hpp
# Opt level: O1

span<const_long,_18446744073709551615UL> __thiscall
jsoncons::typed_array_view::data(typed_array_view *this)

{
  assertion_error *this_00;
  span<const_long,_18446744073709551615UL> sVar1;
  string local_38;
  
  if (this->type_ == int64_value) {
    sVar1.data_ = *(pointer *)&this->data_;
    sVar1.size_ = this->size_;
    return sVar1;
  }
  this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "assertion \'type_ == typed_array_type::int64_value\' failed at  <> :0","");
  assertion_error::assertion_error(this_00,&local_38);
  __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

jsoncons::span<const int64_t> data(int64_array_arg_t) const
        {
            JSONCONS_ASSERT(type_ == typed_array_type::int64_value);
            return jsoncons::span<const int64_t>(data_.int64_data_, size_);
        }